

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

small_vector<float,_4UL,_0UL,_std::allocator<float>_> * __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,
          small_vector<float,_4UL,_0UL,_std::allocator<float>_> *v)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  
  if (this != v) {
    this->m_end = this->m_begin;
    pfVar2 = choose_data(this,(long)v->m_end - (long)v->m_begin >> 2);
    this->m_end = pfVar2;
    this->m_begin = pfVar2;
    pfVar3 = v->m_begin;
    pfVar1 = pfVar2;
    if (pfVar3 != v->m_end) {
      do {
        *pfVar1 = *pfVar3;
        this->m_end = pfVar1 + 1;
        pfVar3 = pfVar3 + 1;
        pfVar1 = pfVar1 + 1;
      } while (pfVar3 != v->m_end);
    }
    sVar4 = 4;
    if ((type *)pfVar2 != this->m_static_data) {
      sVar4 = this->m_dynamic_capacity;
    }
    this->m_capacity = sVar4;
  }
  return this;
}

Assistant:

small_vector& operator=(const small_vector& v)
    {
        if (this == &v)
        {
            // prevent self usurp
            return *this;
        }

        clear();

        m_begin = m_end = choose_data(v.size());

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }

        update_capacity();

        return *this;
    }